

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpOneCommand(cmDocumentation *this,ostream *os)

{
  undefined8 os_00;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string cname;
  ostream *os_local;
  cmDocumentation *this_local;
  
  cname.field_2._8_8_ = os;
  cmsys::SystemTools::LowerCase((string *)local_40,&this->CurrentArgument);
  os_00 = cname.field_2._8_8_;
  std::operator+(&local_60,"command/",(string *)local_40);
  bVar1 = PrintFiles(this,(ostream *)os_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)cname.field_2._8_8_,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    poVar2 = std::operator<<(poVar2,"\" to --help-command is not a CMake command.  ");
    std::operator<<(poVar2,"Use --help-command-list to see all commands.\n");
  }
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneCommand(std::ostream& os)
{
  std::string cname = cmSystemTools::LowerCase(this->CurrentArgument);
  if (this->PrintFiles(os, "command/" + cname)) {
    return true;
  }
  // Argument was not a command.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-command is not a CMake command.  "
     << "Use --help-command-list to see all commands.\n";
  return false;
}